

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ImGuiWindow **ppIVar9;
  ulong uVar10;
  ImGuiWindow **ppIVar11;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar7 = (ulong)uVar1;
  if (uVar7 != 0) {
    uVar6 = 0;
    if (0 < (int)uVar1 && ref_window != (ImGuiWindow *)0x0) {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      ppIVar9 = &pIVar3->Window;
      uVar10 = 1;
      uVar6 = 0;
      do {
        pIVar4 = pIVar3[uVar6].Window;
        if (pIVar4 != (ImGuiWindow *)0x0) {
          uVar2 = pIVar4->Flags;
          if ((uVar2 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                          ,0x1d67,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((uVar2 >> 0x18 & 1) == 0) {
            bVar5 = false;
            uVar8 = uVar10;
            ppIVar11 = ppIVar9;
            do {
              if (*ppIVar11 != (ImGuiWindow *)0x0) {
                if ((*ppIVar11)->RootWindow == ref_window->RootWindow) {
                  bVar5 = true;
                }
              }
              if (uVar7 <= uVar8) break;
              ppIVar11 = ppIVar11 + 6;
              uVar8 = uVar8 + 1;
            } while (!bVar5);
            if (!bVar5) goto LAB_002d0922;
          }
        }
        uVar6 = uVar6 + 1;
        ppIVar9 = ppIVar9 + 6;
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar7);
      uVar6 = (ulong)uVar1;
    }
LAB_002d0922:
    if ((int)uVar6 < (int)uVar1) {
      ClosePopupToLevel((int)uVar6,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack when popups are not direct descendant of the reference window (the reference window is often the NavWindow)
            bool popup_or_descendent_is_ref_window = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_is_ref_window; m++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[m].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                        popup_or_descendent_is_ref_window = true;
            if (!popup_or_descendent_is_ref_window)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}